

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O3

void __thiscall Encoder::DumpInlineeFrameMap(Encoder *this,size_t baseAddress)

{
  ArenaInlineeFrameMap *pAVar1;
  Type pNVar2;
  InlineeFrameRecord *this_00;
  long lVar3;
  long lVar4;
  
  Output::Print(L"Inlinee frame info mapping\n");
  Output::Print(L"---------------------------------------\n");
  pAVar1 = this->m_inlineeFrameMap;
  if (0 < (pAVar1->
          super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>)
          .count) {
    lVar4 = 8;
    lVar3 = 0;
    do {
      pNVar2 = (pAVar1->
               super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>
               ).buffer;
      Output::Print(L"%Ix",*(uint *)((long)pNVar2 + lVar4 + -8) + baseAddress);
      Output::SkipToColumn(0x14);
      this_00 = *(InlineeFrameRecord **)((long)&pNVar2->offset + lVar4);
      if (this_00 == (InlineeFrameRecord *)0x0) {
        Output::Print(L"<NULL>");
      }
      else {
        InlineeFrameRecord::Dump(this_00);
      }
      Output::Print(L"\n");
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar3 < (pAVar1->
                     super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>
                     ).count);
  }
  return;
}

Assistant:

void Encoder::DumpInlineeFrameMap(size_t baseAddress)
{
    Output::Print(_u("Inlinee frame info mapping\n"));
    Output::Print(_u("---------------------------------------\n"));
    m_inlineeFrameMap->Map([=](uint index, NativeOffsetInlineeFramePair& pair) {
        Output::Print(_u("%Ix"), baseAddress + pair.offset);
        Output::SkipToColumn(20);
        if (pair.record)
        {
            pair.record->Dump();
        }
        else
        {
            Output::Print(_u("<NULL>"));
        }
        Output::Print(_u("\n"));
    });
}